

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

bstring bmidstr(const_bstring b,int left,int len)

{
  int local_20;
  int local_1c;
  int len_local;
  int left_local;
  const_bstring b_local;
  
  if (((b == (const_bstring)0x0) || (b->slen < 0)) || (b->data == (uchar *)0x0)) {
    b_local = (const_bstring)0x0;
  }
  else {
    local_20 = len;
    local_1c = left;
    if (left < 0) {
      local_20 = left + len;
      local_1c = 0;
    }
    if (b->slen - local_1c < local_20) {
      local_20 = b->slen - local_1c;
    }
    if (local_20 < 1) {
      b_local = bfromcstr(anon_var_dwarf_23d28 + 0x10);
    }
    else {
      b_local = blk2bstr(b->data + local_1c,local_20);
    }
  }
  return b_local;
}

Assistant:

bstring bmidstr (const_bstring b, int left, int len) {

	if (b == NULL || b->slen < 0 || b->data == NULL) return NULL;

	if (left < 0) {
		len += left;
		left = 0;
	}

	if (len > b->slen - left) len = b->slen - left;

	if (len <= 0) return bfromcstr ("");
	return blk2bstr (b->data + left, len);
}